

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O2

void ihevc_dpb_mgr_init(dpb_mgr_t *ps_dpb_mgr)

{
  undefined8 *puVar1;
  long lVar2;
  
  for (lVar2 = 8; lVar2 != 0x408; lVar2 = lVar2 + 0x10) {
    puVar1 = (undefined8 *)((long)ps_dpb_mgr->as_dpb_info + lVar2 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
  }
  ps_dpb_mgr->u1_num_ref_bufs = '\0';
  ps_dpb_mgr->ps_dpb_head = (dpb_info_t *)0x0;
  return;
}

Assistant:

void ihevc_dpb_mgr_init(dpb_mgr_t *ps_dpb_mgr)
{
    UWORD32 i;
    dpb_info_t *ps_dpb_info = ps_dpb_mgr->as_dpb_info;
    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        ps_dpb_info[i].ps_prev_dpb = NULL;
        ps_dpb_info[i].ps_pic_buf = NULL;

    }

    ps_dpb_mgr->u1_num_ref_bufs = 0;
    ps_dpb_mgr->ps_dpb_head = NULL;

}